

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::GeometryHelper_Make_Arc2D
          (X3DImporter *this,float pStartAngle,float pEndAngle,float pRadius,size_t pNumSegments,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  undefined8 extraout_RAX;
  X3DImporter *pXVar1;
  ulong uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  allocator<char> local_9d;
  float local_9c;
  undefined1 local_98 [32];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_78 = pRadius;
  local_68 = pStartAngle;
  if (6.2831855 < ABS(pStartAngle)) {
    pXVar1 = (X3DImporter *)local_98;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pXVar1,"GeometryHelper_Make_Arc2D.pStartAngle",&local_9d);
    Throw_ArgOutOfRange(pXVar1,(string *)local_98);
  }
  else if (ABS(pEndAngle) <= 6.2831855) {
    if (0.0 < pRadius) {
      fVar5 = ABS(pEndAngle - pStartAngle);
      uVar3 = -(uint)(pEndAngle - pStartAngle == 0.0);
      fVar4 = 6.2831855;
      if (fVar5 <= 6.2831855) {
        fVar4 = fVar5;
      }
      local_48 = (float)(uVar3 & 0x40c90fdb | ~uVar3 & (uint)fVar4);
      local_58 = ZEXT416((uint)(local_48 / (float)pNumSegments));
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      fStack_74 = pRadius;
      fStack_70 = pRadius;
      fStack_6c = pRadius;
      for (uVar2 = 0; uVar2 <= pNumSegments; uVar2 = uVar2 + 1) {
        local_9c = (float)uVar2 * (float)local_58._0_4_ + local_68;
        local_38._M_allocated_capacity._0_4_ = cosf(local_9c);
        fVar4 = sinf(local_9c);
        local_98._0_8_ =
             CONCAT44(fVar4 * fStack_74,(float)local_38._M_allocated_capacity._0_4_ * local_78);
        local_98._8_4_ = 0.0;
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (pVertices,(value_type *)local_98);
      }
      if ((local_48 == 6.2831855) && (!NAN(local_48))) {
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (pVertices,
                   (value_type *)
                   ((pVertices->
                    super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl._M_node.super__List_node_base._M_next + 1));
      }
      return;
    }
    goto LAB_004d8fed;
  }
  pXVar1 = (X3DImporter *)local_98;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pXVar1,"GeometryHelper_Make_Arc2D.pEndAngle",&local_9d);
  Throw_ArgOutOfRange(pXVar1,(string *)local_98);
LAB_004d8fed:
  pXVar1 = (X3DImporter *)local_98;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pXVar1,"GeometryHelper_Make_Arc2D.pRadius",&local_9d);
  Throw_ArgOutOfRange(pXVar1,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::GeometryHelper_Make_Arc2D(const float pStartAngle, const float pEndAngle, const float pRadius, size_t pNumSegments,
												std::list<aiVector3D>& pVertices)
{
	// check argument values ranges.
    if ( ( pStartAngle < -AI_MATH_TWO_PI_F ) || ( pStartAngle > AI_MATH_TWO_PI_F ) )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pStartAngle" );
    }
    if ( ( pEndAngle < -AI_MATH_TWO_PI_F ) || ( pEndAngle > AI_MATH_TWO_PI_F ) )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pEndAngle" );
    }
    if ( pRadius <= 0 )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pRadius" );
    }

	// calculate arc angle and check type of arc
	float angle_full = std::fabs(pEndAngle - pStartAngle);
    if ( ( angle_full > AI_MATH_TWO_PI_F ) || ( angle_full == 0.0f ) )
    {
        angle_full = AI_MATH_TWO_PI_F;
    }

	// calculate angle for one step - angle to next point of line.
	float angle_step = angle_full / (float)pNumSegments;
	// make points
	for(size_t pi = 0; pi <= pNumSegments; pi++)
	{
		float tangle = pStartAngle + pi * angle_step;
		pVertices.push_back(GeometryHelper_Make_Point2D(tangle, pRadius));
	}// for(size_t pi = 0; pi <= pNumSegments; pi++)

	// if we making full circle then add last vertex equal to first vertex
	if(angle_full == AI_MATH_TWO_PI_F) pVertices.push_back(*pVertices.begin());
}